

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ce.cpp
# Opt level: O1

void msd_CE6(uchar **strings,size_t n,size_t depth,uint16_t *oracle,uchar **sorted)

{
  uchar *puVar1;
  ulong uVar2;
  long *__ptr;
  long lVar3;
  long lVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  size_t sVar7;
  size_t i_1;
  
  if (n < 0x10000) {
    msd_CE2_16bit_5(strings,n,depth,(uchar *)oracle,sorted);
    return;
  }
  uVar2 = 0;
  if ((n & 0xfffffffffffffffe) != 0) {
    do {
      puVar1 = strings[uVar2];
      if (puVar1 == (uchar *)0x0) goto LAB_00202501;
      if (puVar1[depth] == '\0') {
        uVar5 = 0;
      }
      else {
        uVar5 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
      }
      puVar1 = strings[uVar2 + 1];
      if (puVar1 == (uchar *)0x0) goto LAB_00202501;
      if (puVar1[depth] == '\0') {
        uVar6 = 0;
      }
      else {
        uVar6 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
      }
      oracle[uVar2] = uVar5;
      oracle[uVar2 + 1] = uVar6;
      uVar2 = uVar2 + 2;
    } while (uVar2 < (n & 0xfffffffffffffffe));
  }
  if (uVar2 < n) {
    do {
      puVar1 = strings[uVar2];
      if (puVar1 == (uchar *)0x0) {
LAB_00202501:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar1[depth] == '\0') {
        uVar5 = 0;
      }
      else {
        uVar5 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
      }
      oracle[uVar2] = uVar5;
      uVar2 = uVar2 + 1;
    } while (n != uVar2);
  }
  __ptr = (long *)calloc(0x10000,8);
  lVar3 = n + (n == 0);
  lVar4 = 0;
  do {
    __ptr[oracle[lVar4]] = __ptr[oracle[lVar4]] + 1;
    lVar4 = lVar4 + 1;
  } while (lVar3 != lVar4);
  msd_CE6::bucketindex[0] = 0;
  lVar4 = 0;
  sVar7 = 0;
  do {
    sVar7 = sVar7 + __ptr[lVar4];
    msd_CE6::bucketindex[lVar4 + 1] = sVar7;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xffff);
  lVar4 = 0;
  do {
    puVar1 = strings[lVar4];
    sVar7 = msd_CE6::bucketindex[oracle[lVar4]];
    msd_CE6::bucketindex[oracle[lVar4]] = sVar7 + 1;
    sorted[sVar7] = puVar1;
    lVar4 = lVar4 + 1;
  } while (lVar3 != lVar4);
  memcpy(strings,sorted,n << 3);
  lVar3 = *__ptr;
  lVar4 = 1;
  do {
    sVar7 = __ptr[lVar4];
    if (sVar7 != 0) {
      if ((char)lVar4 != '\0') {
        msd_CE6(strings + lVar3,sVar7,depth + 2,oracle,sorted);
      }
      lVar3 = lVar3 + sVar7;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10000);
  free(__ptr);
  return;
}

Assistant:

static void
msd_CE6(unsigned char** strings, size_t n, size_t depth,
		uint16_t* oracle, unsigned char** sorted)
{
	if (n < 0x10000) {
		msd_CE2_16bit_5(strings, n, depth, (unsigned char*)oracle, sorted);
		return;
	}
	{
		size_t i;
		for (i=0; i < n-n%2; i+=2) {
			unsigned char* str1 = strings[i];
			unsigned char* str2 = strings[i+1];
			uint16_t ch1 = get_char<uint16_t>(str1, depth);
			uint16_t ch2 = get_char<uint16_t>(str2, depth);
			oracle[i] = ch1;
			oracle[i+1] = ch2;
		}
		for (; i < n; ++i)
			oracle[i] = get_char<uint16_t>(strings[i], depth);
	}
	size_t* restrict bucketsize = (size_t*)
		calloc(0x10000, sizeof(size_t));
	for (size_t i=0; i < n; ++i)
		++bucketsize[oracle[i]];
	static size_t bucketindex[0x10000];
	bucketindex[0] = 0;
	for (size_t i=1; i < 0x10000; ++i)
		bucketindex[i] = bucketindex[i-1]+bucketsize[i-1];
	for (size_t i=0; i < n; ++i)
		sorted[bucketindex[oracle[i]]++] = strings[i];
	memcpy(strings, sorted, n*sizeof(unsigned char*));
	size_t bsum = bucketsize[0];
	for (size_t i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_CE6(strings+bsum, bucketsize[i],
				depth+2, oracle, sorted);
		bsum += bucketsize[i];
	}
	free(bucketsize);
}